

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O1

PageantKey * pageant_nth_key(int ssh_version,int i)

{
  tree234 *t;
  int iVar1;
  PageantKey *pPVar2;
  
  t = keytree;
  iVar1 = find_first_key_for_version(ssh_version);
  pPVar2 = (PageantKey *)index234(t,i + iVar1);
  if ((pPVar2 == (PageantKey *)0x0) || ((pPVar2->sort).ssh_version != ssh_version)) {
    pPVar2 = (PageantKey *)0x0;
  }
  return pPVar2;
}

Assistant:

static PageantKey *pageant_nth_key(int ssh_version, int i)
{
    PageantKey *pk = index234(
        keytree, find_first_key_for_version(ssh_version) + i);
    if (pk && pk->sort.ssh_version == ssh_version)
        return pk;
    else
        return NULL;
}